

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_abs_storeb_h(DisasContext_conflict14 *ctx)

{
  TCGContext_conflict9 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  TCGv_i32 addr;
  TCGv_i32 temp;
  uint32_t address;
  int32_t r1;
  int32_t op2;
  TCGContext_conflict9 *tcg_ctx;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = extract32(ctx->opcode,8,4);
  uVar2 = extract32(ctx->opcode,0x10,6);
  uVar3 = extract32(ctx->opcode,0x1c,4);
  uVar4 = extract32(ctx->opcode,0x16,4);
  uVar5 = extract32(ctx->opcode,0xc,4);
  uVar6 = uVar2 + uVar3 * 0x40 + uVar4 * 0x400 + uVar5 * 0x4000;
  uVar2 = extract32(ctx->opcode,0x1a,2);
  addr = tcg_const_i32_tricore(tcg_ctx_00,(uVar6 & 0x3c000) << 0xe | uVar6 & 0x3fff);
  if (uVar2 == 0) {
    tcg_gen_qemu_st_i32_tricore
              (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar1],addr,(long)ctx->mem_idx,MO_8);
  }
  else if (uVar2 == 2) {
    tcg_gen_qemu_st_i32_tricore
              (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[(int)uVar1],addr,(long)ctx->mem_idx,MO_16);
  }
  else {
    generate_trap(ctx,2,1);
  }
  tcg_temp_free_i32(tcg_ctx_00,addr);
  return;
}

Assistant:

static void decode_abs_storeb_h(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    int32_t op2;
    int32_t r1;
    uint32_t address;
    TCGv temp;

    r1 = MASK_OP_ABS_S1D(ctx->opcode);
    address = MASK_OP_ABS_OFF18(ctx->opcode);
    op2 = MASK_OP_ABS_OP2(ctx->opcode);

    temp = tcg_const_i32(tcg_ctx, EA_ABS_FORMAT(address));

    switch (op2) {
    case OPC2_32_ABS_ST_B:
        tcg_gen_qemu_st_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r1], temp, ctx->mem_idx, MO_UB);
        break;
    case OPC2_32_ABS_ST_H:
        tcg_gen_qemu_st_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r1], temp, ctx->mem_idx, MO_LEUW);
        break;
    default:
        generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
    }
    tcg_temp_free(tcg_ctx, temp);
}